

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

bool __thiscall
helics::apps::Connector::checkPotentialConnection
          (Connector *this,string_view interfaceName,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *possibleConnections,
          unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
          *potentials,
          vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
          *potentialTemplates,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases)

{
  string_view interface;
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  size_type __rlen;
  apps *this_00;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *aliases_00;
  string_view target;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  _Rb_tree_node_base *local_50;
  
  target._M_len = interfaceName._M_str;
  this_00 = (apps *)interfaceName._M_len;
  local_68._0_8_ = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = (_Rb_tree_node_base *)
             CLI::std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1075:33)>
             ::_M_invoke;
  local_58 = (_Base_ptr)
             CLI::std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1075:33)>
             ::_M_manager;
  iVar2 = makeTargetConnection
                    (this,interfaceName,tagList,possibleConnections,aliases,
                     (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)local_68);
  if (local_58 != (_Base_ptr)0x0) {
    (*(code *)local_58)(local_68,local_68,3);
  }
  if (0 < iVar2) {
    return true;
  }
  bVar1 = makePotentialConnection(this,interfaceName,tagList,potentials,aliases);
  if ((bVar1) ||
     ((aliases_00 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)potentialTemplates,
      (potentialTemplates->
      super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (potentialTemplates->
      super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
      )._M_impl.super__Vector_impl_data._M_finish &&
      (bVar1 = makePotentialTemplateConnection
                         (this,interfaceName,tagList,potentialTemplates,aliases), bVar1)))) {
LAB_00298f74:
    bVar1 = true;
  }
  else {
    if ((aliases->_M_h)._M_element_count != 0) {
      target._M_str = (char *)aliases;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_68,this_00,target,aliases_00);
      for (p_Var3 = local_50; p_Var3 != (_Rb_tree_node_base *)(local_68 + 8);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        interface = *(string_view *)(p_Var3 + 1);
        if (((*(apps **)(p_Var3 + 1) != this_00) ||
            ((this_00 != (apps *)0x0 &&
             (iVar2 = bcmp(p_Var3[1]._M_parent,target._M_len,(size_t)this_00), iVar2 != 0)))) &&
           ((bVar1 = makePotentialConnection(this,interface,tagList,potentials,aliases), bVar1 ||
            (((potentialTemplates->
              super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              )._M_impl.super__Vector_impl_data._M_start !=
              (potentialTemplates->
              super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              )._M_impl.super__Vector_impl_data._M_finish &&
             (bVar1 = makePotentialTemplateConnection
                                (this,*(string_view *)(p_Var3 + 1),tagList,potentialTemplates,
                                 aliases), bVar1)))))) {
          std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_68);
          goto LAB_00298f74;
        }
      }
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_68);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Connector::checkPotentialConnection(
    std::string_view interfaceName,
    const std::vector<std::size_t>& tagList,
    std::unordered_set<std::string_view>& possibleConnections,
    std::unordered_map<std::string_view, PotentialConnections>& potentials,
    std::vector<TemplateMatcher>& potentialTemplates,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    static auto nullConnector = [](std::string_view, std::string_view) {};
    /** potential inputs*/
    auto matched =
        makeTargetConnection(interfaceName, tagList, possibleConnections, aliases, nullConnector);
    if (matched > 0) {
        return true;
    }
    if (makePotentialConnection(interfaceName, tagList, potentials, aliases)) {
        return true;
    }
    if (!potentialTemplates.empty()) {
        if (makePotentialTemplateConnection(interfaceName, tagList, potentialTemplates, aliases)) {
            return true;
        }
    }
    if (!aliases.empty()) {
        auto aliasList = generateAliases(interfaceName, aliases);
        for (const auto& alias : aliasList) {
            if (alias == interfaceName) {
                continue;
            }
            if (makePotentialConnection(alias, tagList, potentials, aliases)) {
                return true;
            }
            if (!potentialTemplates.empty()) {
                if (makePotentialTemplateConnection(alias, tagList, potentialTemplates, aliases)) {
                    return true;
                }
            }
        }
    }
    return false;
}